

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

size_t __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::setBuffer
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,BufKind kind,void *p,size_t size)

{
  int32_t *piVar1;
  Hdr *pHVar2;
  FreeFunc *pFVar3;
  BufHdr *pBVar4;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_28;
  
  *(undefined8 *)((long)p + 8) = 0;
  *(undefined4 *)((long)p + 0x10) = 0;
  *(undefined4 *)((long)p + 0x14) = 1;
  *(undefined ***)p = &PTR__RefCount_0014c0a0;
  *(size_t *)((long)p + 0x18) = size - 0x28;
  *(ulong *)((long)p + 0x20) = (ulong)(kind != BufKind_Shared) << 2;
  local_28.m_p = (Hdr *)0x0;
  local_28.m_refCount = (RefCount *)0x0;
  rc::Ptr<axl::rc::BufHdr>::copy(&local_28,(EVP_PKEY_CTX *)p,(EVP_PKEY_CTX *)p);
  pHVar2 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr;
  if (pHVar2 != (Hdr *)0x0) {
    LOCK();
    piVar1 = &(pHVar2->super_RefCount).m_refCount;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(pHVar2->super_RefCount)._vptr_RefCount)(pHVar2);
      LOCK();
      piVar1 = &(pHVar2->super_RefCount).m_weakRefCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         (pFVar3 = (pHVar2->super_RefCount).m_freeFunc, pFVar3 != (FreeFunc *)0x0)) {
        (*pFVar3)(pHVar2);
      }
    }
  }
  pBVar4 = local_28.m_p;
  (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p = (char *)(local_28.m_p + 1);
  local_28.m_p = (BufHdr *)0x0;
  local_28.m_refCount = (RefCount *)0x0;
  (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr = pBVar4;
  (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count = 0;
  rc::Ptr<axl::rc::BufHdr>::clear(&local_28);
  return size - 0x28;
}

Assistant:

size_t
	setBuffer(
		rc::BufKind kind,
		void* p,
		size_t size
	) {
		ASSERT(size >= sizeof(Hdr) + sizeof(T));

		size_t bufferSize = size - sizeof(Hdr);
		uint_t flags = kind != rc::BufKind_Static ? rc::BufHdrFlag_Exclusive : 0;

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_INPLACE(Hdr, (bufferSize, flags), p, NULL);
		Details::setHdrCount(hdr, 0);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = (T*)(hdr + 1);
		this->m_hdr = hdr.detach();
		this->m_count = 0;

		return bufferSize / sizeof(T);
	}